

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O0

void __thiscall
xray_re::_influence<unsigned_int,_float>::set_wo_reorder
          (_influence<unsigned_int,_float> *this,uint16_t bone0,uint16_t bone1,float weight0)

{
  _bone_weight<unsigned_int,_float> local_30;
  _bone_weight<unsigned_int,_float> bw1;
  _bone_weight<unsigned_int,_float> bw0;
  float weight0_local;
  uint16_t bone1_local;
  uint16_t bone0_local;
  _influence<unsigned_int,_float> *this_local;
  
  if (bone0 == bone1) {
    _bone_weight<unsigned_int,_float>::_bone_weight(&bw0,(uint)bone0,1.0);
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&bw0);
  }
  else {
    _bone_weight<unsigned_int,_float>::_bone_weight(&bw1,(uint)bone0,1.0 - weight0);
    _bone_weight<unsigned_int,_float>::_bone_weight(&local_30,(uint)bone1,weight0);
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&bw1);
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&local_30);
  }
  return;
}

Assistant:

void _influence<Tb, Tw>::set_wo_reorder(uint16_t bone0, uint16_t bone1, float weight0)
{
	if (bone0 == bone1) {
		push_back(_bone_weight<Tb, Tw>(bone0, Tw(1)));
	} else {
		_bone_weight<Tb, Tw> bw0(bone0, Tw(1.f - weight0));
		_bone_weight<Tb, Tw> bw1(bone1, Tw(weight0));
		push_back(bw0);
		push_back(bw1);
	}
}